

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStructType
          (BinaryReaderIR *this,Index index,Index field_count,TypeMut *fields)

{
  vector<wabt::Field,_std::allocator<wabt::Field>_> *this_00;
  char *__s;
  Offset OVar1;
  long *plVar2;
  size_t sVar3;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar4;
  undefined8 *puVar5;
  long lVar6;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_38;
  
  __s = this->filename_;
  sVar3 = strlen(__s);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  tVar4.super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       operator_new(0x48);
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) = sVar3;
  *(char **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                   .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) = __s
  ;
  *(Offset *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
  *(undefined ***)
   tVar4.
   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
   super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       &PTR__TypeModuleField_0019cb70;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = 0;
  puVar5 = (undefined8 *)operator_new(0x68);
  puVar5[1] = 0;
  puVar5[2] = 0;
  *(undefined8 *)((long)puVar5 + 0x14) = 0;
  *(undefined8 *)((long)puVar5 + 0x1c) = 0;
  puVar5[5] = puVar5 + 7;
  puVar5[6] = 0;
  *(undefined1 *)(puVar5 + 7) = 0;
  *(undefined4 *)(puVar5 + 9) = 1;
  *puVar5 = &PTR__StructType_0019d5a8;
  this_00 = (vector<wabt::Field,_std::allocator<wabt::Field>_> *)(puVar5 + 10);
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  puVar5[0xc] = 0;
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::resize(this_00,(ulong)field_count);
  if (field_count != 0) {
    lVar6 = 0;
    do {
      *(undefined8 *)
       (&(((this_00->super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>)._M_impl.
           super__Vector_impl_data._M_start)->type).enum_ + lVar6) =
           *(undefined8 *)((long)&(fields->type).enum_ + lVar6);
      (&((this_00->super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>)._M_impl.
         super__Vector_impl_data._M_start)->mutable_)[lVar6 * 4] = (&fields->mutable_)[lVar6];
      lVar6 = lVar6 + 0xc;
    } while ((ulong)field_count * 0xc != lVar6);
  }
  plVar2 = *(long **)((long)tVar4.
                            super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                            .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                     0x40);
  *(undefined8 **)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = puVar5;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       tVar4.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl != (TypeModuleField *)0x0)
  {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStructType(Index index,
                                    Index field_count,
                                    TypeMut* fields) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto struct_type = std::make_unique<StructType>();
  struct_type->fields.resize(field_count);
  for (Index i = 0; i < field_count; ++i) {
    struct_type->fields[i].type = fields[i].type;
    struct_type->fields[i].mutable_ = fields[i].mutable_;
  }
  field->type = std::move(struct_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}